

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_13f457::CompressorState::deviceUpdate(CompressorState *this,ALCdevice *device)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  
  fVar3 = (float)device->Frequency;
  auVar2._4_4_ = fVar3 * 0.2;
  auVar2._0_4_ = fVar3 * 0.1;
  auVar2._8_4_ = fVar3 * 0.0;
  auVar2._12_4_ = fVar3 * 0.0;
  auVar2 = divps(_Ambi3DDecoderHFScale,auVar2);
  fVar3 = exp2f(auVar2._0_4_ * 2.0);
  fVar1 = exp2f(auVar2._4_4_ * -2.0);
  this->mAttackMult = fVar3;
  this->mReleaseMult = fVar1;
  return;
}

Assistant:

void CompressorState::deviceUpdate(const ALCdevice *device)
{
    /* Number of samples to do a full attack and release (non-integer sample
     * counts are okay).
     */
    const float attackCount{static_cast<float>(device->Frequency) * ATTACK_TIME};
    const float releaseCount{static_cast<float>(device->Frequency) * RELEASE_TIME};

    /* Calculate per-sample multipliers to attack and release at the desired
     * rates.
     */
    mAttackMult  = std::pow(AMP_ENVELOPE_MAX/AMP_ENVELOPE_MIN, 1.0f/attackCount);
    mReleaseMult = std::pow(AMP_ENVELOPE_MIN/AMP_ENVELOPE_MAX, 1.0f/releaseCount);
}